

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O2

bool __thiscall
GdlSlotRefExpression::CheckRuleExpression
          (GdlSlotRefExpression *this,GrcFont *param_1,GdlRenderer *param_2,
          vector<bool,_std::allocator<bool>_> *vfLb,vector<bool,_std::allocator<bool>_> *vfIns,
          vector<bool,_std::allocator<bool>_> *vfDel,bool fValue,bool fValueIsInputSlot)

{
  bool bVar1;
  int iVar2;
  string *this_00;
  reference rVar3;
  allocator local_141;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::to_string(&local_140,this->m_srNumber);
  iVar2 = this->m_srNumber;
  if ((iVar2 < 1) ||
     ((int)((*(int *)&(vfLb->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            *(int *)&(vfLb->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
           (vfLb->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset) < iVar2)) {
    std::__cxx11::string::string((string *)&local_40,"Slot reference out of range: @",&local_141);
    std::__cxx11::string::string((string *)&local_60,(string *)&local_140);
    GrcErrorList::AddError(&g_errorList,0x85e,(GdlObject *)&this->field_0x8,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    this_00 = &local_40;
  }
  else if (fValue) {
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](vfLb,(ulong)(iVar2 - 1));
    if ((*rVar3._M_p & rVar3._M_mask) == 0) {
      iVar2 = this->m_srNumber;
      if (fValueIsInputSlot) goto LAB_0013cb70;
      rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](vfDel,(long)iVar2 - 1);
      if ((*rVar3._M_p & rVar3._M_mask) != 0) {
        std::__cxx11::string::string
                  ((string *)&local_100,"Illegal reference to deleted slot: @",&local_141);
        std::__cxx11::string::string((string *)&local_120,(string *)&local_140);
        GrcErrorList::AddError
                  (&g_errorList,0x861,(GdlObject *)&this->field_0x8,&local_100,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        this_00 = &local_100;
        goto LAB_0013cab7;
      }
      goto LAB_0013cc58;
    }
    std::__cxx11::string::string
              ((string *)&local_80,"Illegal reference to line-break slot: @",&local_141);
    std::__cxx11::string::string((string *)&local_a0,(string *)&local_140);
    GrcErrorList::AddError(&g_errorList,0x85f,(GdlObject *)&this->field_0x8,&local_80,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    this_00 = &local_80;
  }
  else {
LAB_0013cb70:
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](vfIns,(long)(iVar2 + -1));
    if ((*rVar3._M_p & rVar3._M_mask) == 0) {
LAB_0013cc58:
      bVar1 = true;
      goto LAB_0013cabe;
    }
    std::__cxx11::string::string
              ((string *)&local_c0,"Illegal reference to inserted slot: @",&local_141);
    std::__cxx11::string::string((string *)&local_e0,(string *)&local_140);
    GrcErrorList::AddError(&g_errorList,0x860,(GdlObject *)&this->field_0x8,&local_c0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    this_00 = &local_c0;
  }
LAB_0013cab7:
  std::__cxx11::string::~string((string *)this_00);
  bVar1 = false;
LAB_0013cabe:
  std::__cxx11::string::~string((string *)&local_140);
  return bVar1;
}

Assistant:

bool GdlSlotRefExpression::CheckRuleExpression(GrcFont * /*pfont*/, GdlRenderer * /*prndr*/,
	std::vector<bool> & vfLb, std::vector<bool> & vfIns, std::vector<bool> & vfDel,
	bool fValue, bool fValueIsInputSlot)
{
	auto const staSlotNumber = std::to_string(m_srNumber);

	if (m_srNumber < 1 || m_srNumber > signed(vfLb.size()))
	{
		g_errorList.AddError(2142, this,
			"Slot reference out of range: @",
			staSlotNumber);
		return false;
	}
	else if (fValue && vfLb[m_srNumber - 1])
	{
		//	Eg, attach.to = @2 or comp.X.ref = @2, where @2 is a LB slot
		g_errorList.AddError(2143, this,
			"Illegal reference to line-break slot: @",
			staSlotNumber);
		return false;
	}
	else if ((!fValue || fValueIsInputSlot) && vfIns[m_srNumber - 1])
	{
		//	Eg, @1.bb.width or comp.X.ref = @1, where @1 is being inserted
		g_errorList.AddError(2144, this,
			"Illegal reference to inserted slot: @",
			staSlotNumber);
		return false;
	}
	else if (fValue && !fValueIsInputSlot && vfDel[m_srNumber - 1])
	{
		//	Eg, attach.to = @3, where @3 is being deleted
		g_errorList.AddError(2145, this,
			"Illegal reference to deleted slot: @",
			staSlotNumber);
		return false;
	}
	else
		return true;
}